

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc_sse2.c
# Opt level: O2

void SubtractGreenFromBlueAndRed_SSE2(uint32_t *argb_data,int num_pixels)

{
  undefined1 auVar1 [16];
  long lVar2;
  undefined1 in_XMM1 [16];
  undefined1 auVar3 [16];
  
  lVar2 = 0;
  while (lVar2 + 4 <= (long)num_pixels) {
    auVar1 = *(undefined1 (*) [16])argb_data;
    auVar3 = pshuflw(in_XMM1,auVar1,0xa0);
    auVar3 = pshufhw(auVar3,auVar3,0xa0);
    in_XMM1._0_2_ = auVar3._0_2_ >> 8;
    in_XMM1._2_2_ = auVar3._2_2_ >> 8;
    in_XMM1._4_2_ = auVar3._4_2_ >> 8;
    in_XMM1._6_2_ = auVar3._6_2_ >> 8;
    in_XMM1._8_2_ = auVar3._8_2_ >> 8;
    in_XMM1._10_2_ = auVar3._10_2_ >> 8;
    in_XMM1._12_2_ = auVar3._12_2_ >> 8;
    in_XMM1._14_2_ = auVar3._14_2_ >> 8;
    (*(undefined1 (*) [16])argb_data)[0] = auVar1[0] - auVar3[1];
    (*(undefined1 (*) [16])argb_data)[1] = auVar1[1];
    (*(undefined1 (*) [16])argb_data)[2] = auVar1[2] - auVar3[3];
    (*(undefined1 (*) [16])argb_data)[3] = auVar1[3];
    (*(undefined1 (*) [16])argb_data)[4] = auVar1[4] - auVar3[5];
    (*(undefined1 (*) [16])argb_data)[5] = auVar1[5];
    (*(undefined1 (*) [16])argb_data)[6] = auVar1[6] - auVar3[7];
    (*(undefined1 (*) [16])argb_data)[7] = auVar1[7];
    (*(undefined1 (*) [16])argb_data)[8] = auVar1[8] - auVar3[9];
    (*(undefined1 (*) [16])argb_data)[9] = auVar1[9];
    (*(undefined1 (*) [16])argb_data)[10] = auVar1[10] - auVar3[0xb];
    (*(undefined1 (*) [16])argb_data)[0xb] = auVar1[0xb];
    (*(undefined1 (*) [16])argb_data)[0xc] = auVar1[0xc] - auVar3[0xd];
    (*(undefined1 (*) [16])argb_data)[0xd] = auVar1[0xd];
    (*(undefined1 (*) [16])argb_data)[0xe] = auVar1[0xe] - auVar3[0xf];
    (*(undefined1 (*) [16])argb_data)[0xf] = auVar1[0xf];
    argb_data = (uint32_t *)((long)argb_data + 0x10);
    lVar2 = lVar2 + 4;
  }
  if (num_pixels == (int)lVar2) {
    return;
  }
  VP8LSubtractGreenFromBlueAndRed_C(argb_data,num_pixels - (int)lVar2);
  return;
}

Assistant:

static void SubtractGreenFromBlueAndRed_SSE2(uint32_t* argb_data,
                                             int num_pixels) {
  int i;
  for (i = 0; i + 4 <= num_pixels; i += 4) {
    const __m128i in = _mm_loadu_si128((__m128i*)&argb_data[i]); // argb
    const __m128i A = _mm_srli_epi16(in, 8);     // 0 a 0 g
    const __m128i B = _mm_shufflelo_epi16(A, _MM_SHUFFLE(2, 2, 0, 0));
    const __m128i C = _mm_shufflehi_epi16(B, _MM_SHUFFLE(2, 2, 0, 0));  // 0g0g
    const __m128i out = _mm_sub_epi8(in, C);
    _mm_storeu_si128((__m128i*)&argb_data[i], out);
  }
  // fallthrough and finish off with plain-C
  if (i != num_pixels) {
    VP8LSubtractGreenFromBlueAndRed_C(argb_data + i, num_pixels - i);
  }
}